

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O2

void __thiscall Rml::ElementStyle::UpdateDefinition(ElementStyle *this)

{
  SharedPtr<const_ElementDefinition> *this_00;
  ElementDefinition *pEVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  PropertyIdSet *pPVar4;
  _Base_bitset<2UL> *__x;
  PropertyIdSet *__y;
  Property *this_01;
  Property *other;
  PropertyId id;
  PropertyIdSetIterator PVar5;
  SharedPtr<const_ElementDefinition> new_definition;
  PropertyIdSet changed_properties;
  PropertyIdSetIterator __begin3;
  PropertyIdSet properties_in_both_definitions;
  __shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  PropertyIdSetIterator local_58;
  ElementStyle *local_48;
  _Base_bitset<2UL> local_40;
  
  local_78._M_ptr = (ElementDefinition *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar3 = (*(this->element->super_ScriptInterface).super_Releasable._vptr_Releasable[4])();
  if ((Element *)CONCAT44(extraout_var,iVar3) != (Element *)0x0) {
    StyleSheet::GetElementDefinition((StyleSheet *)local_68,(Element *)CONCAT44(extraout_var,iVar3))
    ;
    ::std::__shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_78,
               (__shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2> *)local_68);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  }
  pEVar1 = (this->definition).
           super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_78._M_ptr != pEVar1) {
    local_68 = (undefined1  [8])0x0;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (pEVar1 != (ElementDefinition *)0x0) {
      pPVar4 = ElementDefinition::GetPropertyIds(pEVar1);
      local_68 = (undefined1  [8])(pPVar4->defined_ids).super__Base_bitset<2UL>._M_w[0];
      _Stack_60._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (pPVar4->defined_ids).super__Base_bitset<2UL>._M_w[1];
    }
    this_00 = &this->definition;
    if (local_78._M_ptr != (ElementDefinition *)0x0) {
      __x = (_Base_bitset<2UL> *)ElementDefinition::GetPropertyIds(local_78._M_ptr);
      ::std::_Base_bitset<2UL>::_M_do_or((_Base_bitset<2UL> *)local_68,__x);
      pEVar1 = (this_00->
               super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((pEVar1 != (ElementDefinition *)0x0) && (local_78._M_ptr != (ElementDefinition *)0x0)) {
        pPVar4 = ElementDefinition::GetPropertyIds(pEVar1);
        __y = ElementDefinition::GetPropertyIds(local_78._M_ptr);
        local_40._M_w = (_WordT  [2])::std::operator&(&pPVar4->defined_ids,&__y->defined_ids);
        local_58 = PropertyIdSet::begin((PropertyIdSet *)&local_40);
        local_48 = this;
        PVar5 = PropertyIdSet::end((PropertyIdSet *)&local_40);
        while (this = local_48, PVar5 != local_58) {
          id = (PropertyId)local_58.id_index;
          this_01 = ElementDefinition::GetProperty
                              ((this_00->
                               super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr,id);
          other = ElementDefinition::GetProperty(local_78._M_ptr,id);
          if (other != (Property *)0x0 && this_01 != (Property *)0x0) {
            bVar2 = Property::operator==(this_01,other);
            if (bVar2) {
              PropertyIdSet::Erase((PropertyIdSet *)local_68,id);
            }
          }
          PropertyIdSetIterator::operator++(&local_58);
        }
        TransitionPropertyChanges
                  (local_48->element,(PropertyIdSet *)local_68,&local_48->inline_properties,
                   (local_48->definition).
                   super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_78._M_ptr);
      }
    }
    ::std::__shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->
                super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>,
               &local_78);
    ::std::_Base_bitset<2UL>::_M_do_or
              ((_Base_bitset<2UL> *)&this->dirty_properties,(_Base_bitset<2UL> *)local_68);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  return;
}

Assistant:

void ElementStyle::UpdateDefinition()
{
	RMLUI_ZoneScoped;

	SharedPtr<const ElementDefinition> new_definition;

	if (const StyleSheet* style_sheet = element->GetStyleSheet())
	{
		new_definition = style_sheet->GetElementDefinition(element);
	}

	// Switch the property definitions if the definition has changed.
	if (new_definition != definition)
	{
		PropertyIdSet changed_properties;

		if (definition)
			changed_properties = definition->GetPropertyIds();

		if (new_definition)
			changed_properties |= new_definition->GetPropertyIds();

		if (definition && new_definition)
		{
			// Remove properties that compare equal from the changed list.
			const PropertyIdSet properties_in_both_definitions = (definition->GetPropertyIds() & new_definition->GetPropertyIds());

			for (PropertyId id : properties_in_both_definitions)
			{
				const Property* p0 = definition->GetProperty(id);
				const Property* p1 = new_definition->GetProperty(id);
				if (p0 && p1 && *p0 == *p1)
					changed_properties.Erase(id);
			}

			// Transition changed properties if transition property is set
			TransitionPropertyChanges(element, changed_properties, inline_properties, definition.get(), new_definition.get());
		}

		definition = new_definition;

		DirtyProperties(changed_properties);
	}
}